

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLVisualSceneLoader.cpp
# Opt level: O2

void __thiscall
COLLADASaxFWL::VisualSceneLoader::VisualSceneLoader
          (VisualSceneLoader *this,IFilePartLoader *callingFilePartLoader,char *id)

{
  VisualScene *this_00;
  UniqueId UStack_38;
  
  FilePartLoader::FilePartLoader(&this->super_FilePartLoader,callingFilePartLoader);
  NodeLoader::NodeLoader(&this->super_NodeLoader);
  (this->super_FilePartLoader).super_IFilePartLoader.super_ExtraDataLoader._vptr_ExtraDataLoader =
       (_func_int **)&PTR__VisualSceneLoader_0095f598;
  (this->super_NodeLoader).super_HelperLoaderBase._vptr_HelperLoaderBase =
       (_func_int **)&PTR__VisualSceneLoader_0095f638;
  this_00 = (VisualScene *)operator_new(0x68);
  IFilePartLoader::createUniqueIdFromId(&UStack_38,(IFilePartLoader *)this,id,VISUAL_SCENE);
  COLLADAFW::VisualScene::VisualScene(this_00,&UStack_38);
  COLLADAFW::UniqueId::~UniqueId(&UStack_38);
  this->mVisualScene = this_00;
  this->mInNode = false;
  (this->super_NodeLoader).super_HelperLoaderBase.mHandlingFilePartLoader =
       &this->super_FilePartLoader;
  return;
}

Assistant:

VisualSceneLoader::VisualSceneLoader( IFilePartLoader* callingFilePartLoader, const char* id )
		: FilePartLoader(callingFilePartLoader)
        , mVisualScene(new COLLADAFW::VisualScene(createUniqueIdFromId(id, COLLADAFW::VisualScene::ID())))
        , mInNode (false)
	{
		NodeLoader::setHandlingFilePartLoader(this);
	}